

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void SyDosTimeFormat(sxu32 nDosDate,Sytm *pOut)

{
  pOut->tm_isdst = 0;
  pOut->tm_year = (nDosDate >> 0x19) + 0x7bc;
  pOut->tm_mon = nDosDate >> 0x15 & 0xf;
  pOut->tm_mday = nDosDate >> 0x10 & 0x1f;
  pOut->tm_hour = nDosDate >> 0xb & 0x1f;
  pOut->tm_min = nDosDate >> 5 & 0x3f;
  pOut->tm_sec = nDosDate * 2 & 0x3e;
  return;
}

Assistant:

JX9_PRIVATE void SyDosTimeFormat(sxu32 nDosDate, Sytm *pOut)
{
	sxu16 nDate;
	sxu16 nTime;
	nDate = nDosDate >> 16;
	nTime = nDosDate & 0xFFFF;
	pOut->tm_isdst  = 0;
	pOut->tm_year 	= 1980 + (nDate >> 9);
	pOut->tm_mon	= (nDate % (1<<9))>>5;
	pOut->tm_mday	= (nDate % (1<<9))&0x1F;
	pOut->tm_hour	= nTime >> 11;
	pOut->tm_min	= (nTime % (1<<11)) >> 5;
	pOut->tm_sec	= ((nTime % (1<<11))& 0x1F )<<1;
}